

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpack.cxx
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  ulong uVar6;
  reference name;
  cmCPackGenerator *this;
  undefined4 extraout_var;
  DescriptionsMap *pDVar7;
  bool collapse;
  bool collapse_00;
  bool collapse_01;
  bool bVar8;
  bool bVar9;
  bool local_3f2a;
  undefined1 local_3e88 [8];
  cmDocumentationEntry e_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *g_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  DescriptionsMap *__range2_1;
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> v_1;
  string local_3e00;
  string local_3de0 [32];
  undefined1 local_3dc0 [8];
  ostringstream cmCPackLog_msg_18;
  string local_3c40 [4];
  int res;
  allocator<char> local_3c19;
  string local_3c18;
  undefined1 local_3bf8 [8];
  ostringstream ostr;
  allocator<char> local_3a79;
  string local_3a78;
  char *local_3a58;
  char *projVersionPatch;
  string local_3a48;
  char *local_3a28;
  char *projVersionMinor;
  string local_3a18;
  char *local_39f8;
  char *projVersionMajor;
  string local_39e8;
  char *local_39c8;
  char *projVersion;
  undefined1 local_39a0 [8];
  ostringstream cmCPackLog_msg_17;
  string local_3828 [32];
  undefined1 local_3808 [8];
  ostringstream cmCPackLog_msg_16;
  allocator<char> local_3689;
  string local_3688;
  char *local_3668;
  char *projName;
  undefined1 local_3640 [8];
  ostringstream cmCPackLog_msg_15;
  allocator<char> local_34c1;
  string local_34c0;
  byte local_349b;
  byte local_349a;
  allocator<char> local_3499;
  string local_3498;
  byte local_3473;
  byte local_3472;
  allocator<char> local_3471;
  string local_3470;
  allocator<char> local_3449;
  string local_3448;
  string local_3428 [32];
  undefined1 local_3408 [8];
  ostringstream cmCPackLog_msg_14;
  undefined1 local_3290 [8];
  cmDocumentationEntry e;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *g;
  const_iterator __end6;
  const_iterator __begin6;
  DescriptionsMap *__range6;
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> v;
  cmDocumentation generatorDocs;
  undefined1 local_3148 [8];
  ostringstream cmCPackLog_msg_13;
  string local_2fd0 [32];
  undefined1 local_2fb0 [8];
  ostringstream cmCPackLog_msg_12;
  allocator<char> local_2e31;
  string local_2e30;
  byte local_2e0b;
  byte local_2e0a;
  allocator<char> local_2e09;
  string local_2e08;
  byte local_2de3;
  byte local_2de2;
  allocator<char> local_2de1;
  string local_2de0;
  byte local_2dbb;
  byte local_2dba;
  allocator<char> local_2db9;
  string local_2db8;
  string local_2d98 [32];
  undefined1 local_2d78 [8];
  ostringstream cmCPackLog_msg_11;
  allocator<char> local_2bf9;
  string local_2bf8;
  string local_2bd8 [32];
  undefined1 local_2bb8 [8];
  ostringstream cmCPackLog_msg_10;
  cmMakefile *mf;
  ScopePushPop raii;
  string *gen;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  string local_2a08;
  undefined1 local_29e8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  generatorsVector;
  undefined1 local_29b0 [8];
  ostringstream cmCPackLog_msg_9;
  allocator<char> local_2831;
  string local_2830;
  char *local_2810;
  char *genList;
  string local_2800;
  allocator<char> local_27d9;
  string local_27d8;
  char *local_27b8;
  char *cpackModulesPath;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *cd;
  iterator __end2;
  iterator __begin2;
  MapType *__range2;
  string local_2788;
  allocator<char> local_2761;
  string local_2760;
  string local_2740;
  allocator<char> local_2719;
  string local_2718;
  allocator<char> local_26f1;
  string local_26f0;
  allocator<char> local_26c9;
  string local_26c8;
  allocator<char> local_26a1;
  string local_26a0;
  allocator<char> local_2679;
  string local_2678;
  string local_2658 [32];
  undefined1 local_2638 [8];
  ostringstream cmCPackLog_msg_8;
  string local_24c0 [32];
  undefined1 local_24a0 [8];
  ostringstream cmCPackLog_msg_7;
  string local_2328 [32];
  undefined1 local_2308 [8];
  ostringstream cmCPackLog_msg_6;
  string local_2190;
  allocator<char> local_2169;
  string local_2168;
  string local_2148 [32];
  undefined1 local_2128 [8];
  ostringstream cmCPackLog_msg_5;
  allocator<char> local_1fa9;
  string local_1fa8;
  string local_1f88;
  string local_1f68 [32];
  undefined1 local_1f48 [8];
  ostringstream cmCPackLog_msg_4;
  allocator<char> local_1dc9;
  string local_1dc8;
  undefined1 local_1da8 [8];
  string systemFile;
  cmDocumentation doc;
  cmCPackGenerator *cpackGenerator;
  cmCPackGeneratorFactory generators;
  undefined1 local_1c30 [7];
  bool cpackConfigFileSpecified;
  undefined1 local_1c18 [8];
  cmMakefile globalMF;
  cmGlobalGenerator cmgg;
  ProgressCallbackType local_e10;
  allocator<char> local_de9;
  string local_de8;
  allocator<char> local_dc1;
  string local_dc0;
  undefined1 local_da0 [8];
  cmake cminst;
  undefined1 local_a28 [8];
  ostringstream cmCPackLog_msg_3;
  string local_8b0 [32];
  undefined1 local_890 [8];
  ostringstream cmCPackLog_msg_2;
  string local_718 [32];
  undefined1 local_6f8 [8];
  ostringstream cmCPackLog_msg_1;
  int local_57c;
  undefined1 local_578 [4];
  int parsed;
  CommandLineArguments arg;
  cpackDefinitions definitions;
  string cpackConfigFile;
  string cpackProjectVendor;
  string cpackProjectPatch;
  string cpackProjectVersion;
  string cpackBuildConfig;
  string cpackProjectDirectory;
  string cpackProjectName;
  string helpHTML;
  string helpMAN;
  string helpFull;
  undefined1 local_3c8 [2];
  bool debug;
  bool traceExpand;
  bool trace;
  bool verbose;
  bool helpVersion;
  bool help;
  string generator;
  string local_3a0 [32];
  undefined1 local_380 [8];
  ostringstream cmCPackLog_msg;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  allocator<char> local_1b9;
  string local_1b8;
  allocator<char> local_191;
  string local_190;
  allocator<char> local_169;
  string local_168;
  undefined1 local_148 [8];
  cmCPackLog log;
  undefined1 local_30 [8];
  CommandLineArguments args;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = argv;
  cmsys::Encoding::CommandLineArguments::Main((CommandLineArguments *)local_30,argc,argv);
  iVar3 = cmsys::Encoding::CommandLineArguments::argc((CommandLineArguments *)local_30);
  args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = cmsys::Encoding::CommandLineArguments::argv((CommandLineArguments *)local_30);
  cmsys::SystemTools::EnableMSVCDebugHook();
  cmSystemTools::InitializeLibUV();
  cmSystemTools::FindCMakeResources
            (*args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cmCPackLog::cmCPackLog((cmCPackLog *)local_148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,"CPack Error: ",&local_169);
  cmCPackLog::SetErrorPrefix((cmCPackLog *)local_148,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator(&local_169);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,"CPack Warning: ",&local_191);
  cmCPackLog::SetWarningPrefix((cmCPackLog *)local_148,&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator(&local_191);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"CPack: ",&local_1b9);
  cmCPackLog::SetOutputPrefix((cmCPackLog *)local_148,&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,"CPack Verbose: ",&local_1e1);
  cmCPackLog::SetVerbosePrefix((cmCPackLog *)local_148,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_(&local_208,(SystemTools *)0x1,collapse);
  bVar1 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)&local_208);
  if ((bVar1 & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_380);
    poVar4 = std::operator<<((ostream *)local_380,"Current working directory cannot be established."
                            );
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log((cmCPackLog *)local_148,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                    ,0x7e,pcVar5);
    std::__cxx11::string::~string(local_3a0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_380);
    argv_local._4_4_ = 1;
    generator.field_2._12_4_ = 1;
    goto LAB_0014396a;
  }
  std::__cxx11::string::string((string *)local_3c8);
  helpFull.field_2._M_local_buf[0xf] = '\0';
  helpFull.field_2._M_local_buf[0xe] = '\0';
  helpFull.field_2._M_local_buf[0xd] = '\0';
  helpFull.field_2._M_local_buf[0xc] = '\0';
  helpFull.field_2._M_local_buf[0xb] = '\0';
  helpFull.field_2._M_local_buf[10] = '\0';
  std::__cxx11::string::string((string *)(helpMAN.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(helpHTML.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(cpackProjectName.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(cpackProjectDirectory.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(cpackBuildConfig.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(cpackProjectVersion.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(cpackProjectPatch.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(cpackProjectVendor.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(cpackConfigFile.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&definitions.Log);
  cpackDefinitions::cpackDefinitions((cpackDefinitions *)&arg.LineLength);
  definitions.Map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_148;
  std::__cxx11::string::clear();
  cmsys::CommandLineArguments::CommandLineArguments((CommandLineArguments *)local_578);
  cmsys::CommandLineArguments::Initialize
            ((CommandLineArguments *)local_578,iVar3,
             args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  cmsys::CommandLineArguments::AddArgument
            ((CommandLineArguments *)local_578,"--help",NO_ARGUMENT,
             (bool *)(helpFull.field_2._M_local_buf + 0xf),"CPack help");
  cmsys::CommandLineArguments::AddArgument
            ((CommandLineArguments *)local_578,"--help-full",SPACE_ARGUMENT,
             (string *)((long)&helpMAN.field_2 + 8),"CPack help");
  cmsys::CommandLineArguments::AddArgument
            ((CommandLineArguments *)local_578,"--help-html",SPACE_ARGUMENT,
             (string *)((long)&cpackProjectName.field_2 + 8),"CPack help");
  cmsys::CommandLineArguments::AddArgument
            ((CommandLineArguments *)local_578,"--help-man",SPACE_ARGUMENT,
             (string *)((long)&helpHTML.field_2 + 8),"CPack help");
  cmsys::CommandLineArguments::AddArgument
            ((CommandLineArguments *)local_578,"--version",NO_ARGUMENT,
             (bool *)(helpFull.field_2._M_local_buf + 0xe),"CPack help");
  cmsys::CommandLineArguments::AddArgument
            ((CommandLineArguments *)local_578,"-V",NO_ARGUMENT,
             (bool *)(helpFull.field_2._M_local_buf + 0xd),"CPack verbose");
  cmsys::CommandLineArguments::AddArgument
            ((CommandLineArguments *)local_578,"--verbose",NO_ARGUMENT,
             (bool *)(helpFull.field_2._M_local_buf + 0xd),"-V");
  cmsys::CommandLineArguments::AddArgument
            ((CommandLineArguments *)local_578,"--debug",NO_ARGUMENT,
             (bool *)(helpFull.field_2._M_local_buf + 10),"-V");
  cmsys::CommandLineArguments::AddArgument
            ((CommandLineArguments *)local_578,"--config",SPACE_ARGUMENT,(string *)&definitions.Log,
             "CPack configuration file");
  cmsys::CommandLineArguments::AddArgument
            ((CommandLineArguments *)local_578,"--trace",NO_ARGUMENT,
             (bool *)(helpFull.field_2._M_local_buf + 0xc),
             "Put underlying cmake scripts in trace mode.");
  cmsys::CommandLineArguments::AddArgument
            ((CommandLineArguments *)local_578,"--trace-expand",NO_ARGUMENT,
             (bool *)(helpFull.field_2._M_local_buf + 0xb),
             "Put underlying cmake scripts in expanded trace mode.");
  cmsys::CommandLineArguments::AddArgument
            ((CommandLineArguments *)local_578,"-C",SPACE_ARGUMENT,
             (string *)((long)&cpackProjectVersion.field_2 + 8),"CPack build configuration");
  cmsys::CommandLineArguments::AddArgument
            ((CommandLineArguments *)local_578,"-G",SPACE_ARGUMENT,(string *)local_3c8,
             "CPack generator");
  cmsys::CommandLineArguments::AddArgument
            ((CommandLineArguments *)local_578,"-P",SPACE_ARGUMENT,
             (string *)((long)&cpackProjectDirectory.field_2 + 8),"CPack project name");
  cmsys::CommandLineArguments::AddArgument
            ((CommandLineArguments *)local_578,"-R",SPACE_ARGUMENT,
             (string *)((long)&cpackProjectPatch.field_2 + 8),"CPack project version");
  cmsys::CommandLineArguments::AddArgument
            ((CommandLineArguments *)local_578,"-B",SPACE_ARGUMENT,
             (string *)((long)&cpackBuildConfig.field_2 + 8),"CPack project directory");
  cmsys::CommandLineArguments::AddArgument
            ((CommandLineArguments *)local_578,"--patch",SPACE_ARGUMENT,
             (string *)((long)&cpackProjectVendor.field_2 + 8),"CPack project patch");
  cmsys::CommandLineArguments::AddArgument
            ((CommandLineArguments *)local_578,"--vendor",SPACE_ARGUMENT,
             (string *)((long)&cpackConfigFile.field_2 + 8),"CPack project vendor");
  cmsys::CommandLineArguments::AddCallback
            ((CommandLineArguments *)local_578,"-D",SPACE_ARGUMENT,cpackDefinitionArgument,
             &arg.LineLength,"CPack Definitions");
  cmsys::CommandLineArguments::SetUnknownArgumentCallback
            ((CommandLineArguments *)local_578,cpackUnknownArgument);
  local_57c = cmsys::CommandLineArguments::Parse((CommandLineArguments *)local_578);
  if ((helpFull.field_2._M_local_buf[0xd] & 1U) != 0) {
    cmCPackLog::SetVerbose((cmCPackLog *)local_148,(bool)(helpFull.field_2._M_local_buf[0xd] & 1));
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6f8);
    poVar4 = std::operator<<((ostream *)local_6f8,"Enable Verbose");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log((cmCPackLog *)local_148,1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                    ,0xc6,pcVar5);
    std::__cxx11::string::~string(local_718);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6f8);
  }
  if ((helpFull.field_2._M_local_buf[10] & 1U) != 0) {
    cmCPackLog::SetDebug((cmCPackLog *)local_148,(bool)(helpFull.field_2._M_local_buf[10] & 1));
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_890);
    poVar4 = std::operator<<((ostream *)local_890,"Enable Debug");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log((cmCPackLog *)local_148,1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                    ,0xca,pcVar5);
    std::__cxx11::string::~string(local_8b0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_890);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a28);
  poVar4 = std::operator<<((ostream *)local_a28,"Read CPack config file: ");
  poVar4 = std::operator<<(poVar4,(string *)&definitions.Log);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::ostringstream::str();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmCPackLog::Log((cmCPackLog *)local_148,2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                  ,0xce,pcVar5);
  std::__cxx11::string::~string
            ((string *)
             &cminst.TraceOnlyThisSources.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a28);
  cmake::cmake((cmake *)local_da0,RoleScript,CPack);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_dc0,"",&local_dc1);
  cmake::SetHomeDirectory((cmake *)local_da0,&local_dc0);
  std::__cxx11::string::~string((string *)&local_dc0);
  std::allocator<char>::~allocator(&local_dc1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_de8,"",&local_de9);
  cmake::SetHomeOutputDirectory((cmake *)local_da0,&local_de8);
  std::__cxx11::string::~string((string *)&local_de8);
  std::allocator<char>::~allocator(&local_de9);
  std::function<void(std::__cxx11::string_const&,float)>::
  function<void(&)(std::__cxx11::string_const&,float),void>
            ((function<void(std::__cxx11::string_const&,float)> *)&local_e10,cpackProgressCallback);
  cmake::SetProgressCallback((cmake *)local_da0,&local_e10);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float)>
  ::~function(&local_e10);
  cmake::GetCurrentSnapshot((cmStateSnapshot *)&cmgg.InstallTargetEnabled,(cmake *)local_da0);
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)&cmgg.InstallTargetEnabled);
  cmGlobalGenerator::cmGlobalGenerator
            ((cmGlobalGenerator *)&globalMF.IsSourceFileTryCompile,(cmake *)local_da0);
  cmake::GetCurrentSnapshot((cmStateSnapshot *)local_1c30,(cmake *)local_da0);
  cmMakefile::cmMakefile
            ((cmMakefile *)local_1c18,(cmGlobalGenerator *)&globalMF.IsSourceFileTryCompile,
             (cmStateSnapshot *)local_1c30);
  if ((helpFull.field_2._M_local_buf[0xc] & 1U) != 0) {
    cmake::SetTrace((cmake *)local_da0,true);
  }
  if ((helpFull.field_2._M_local_buf[0xb] & 1U) != 0) {
    cmake::SetTrace((cmake *)local_da0,true);
    cmake::SetTraceExpand((cmake *)local_da0,true);
  }
  uVar6 = std::__cxx11::string::empty();
  bVar8 = (uVar6 & 1) != 0;
  if (bVar8) {
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              ((string *)&generators.Logger,(SystemTools *)0x1,collapse_00);
    std::__cxx11::string::operator=((string *)&definitions.Log,(string *)&generators.Logger);
    std::__cxx11::string::~string((string *)&generators.Logger);
    std::__cxx11::string::operator+=((string *)&definitions.Log,"/CPackConfig.cmake");
  }
  cmCPackGeneratorFactory::cmCPackGeneratorFactory((cmCPackGeneratorFactory *)&cpackGenerator);
  cmCPackGeneratorFactory::SetLogger
            ((cmCPackGeneratorFactory *)&cpackGenerator,(cmCPackLog *)local_148);
  cmDocumentation::cmDocumentation((cmDocumentation *)((long)&systemFile.field_2 + 8));
  cmDocumentation::addCPackStandardDocSections((cmDocumentation *)((long)&systemFile.field_2 + 8));
  local_3f2a = cmDocumentation::CheckOptions
                         ((cmDocumentation *)((long)&systemFile.field_2 + 8),iVar3,
                          args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,"-G");
  local_3f2a = local_3f2a && iVar3 != 1;
  helpFull.field_2._M_local_buf[0xf] = local_3f2a;
  cmake::AddCMakePaths((cmake *)local_da0);
  if ((local_57c == 0) || ((helpFull.field_2._M_local_buf[0xf] & 1U) != 0)) {
LAB_001434ed:
    if ((helpFull.field_2._M_local_buf[0xf] & 1U) == 0) {
      bVar8 = cmSystemTools::GetErrorOccuredFlag();
      if (bVar8) {
        argv_local._4_4_ = 1;
        generator.field_2._12_4_ = 1;
      }
      else {
        argv_local._4_4_ = 0;
        generator.field_2._12_4_ = 1;
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3e00,"cpack",
                 (allocator<char> *)
                 ((long)&v_1.
                         super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      cmDocumentation::SetName((cmDocumentation *)((long)&systemFile.field_2 + 8),&local_3e00);
      std::__cxx11::string::~string((string *)&local_3e00);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&v_1.
                         super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      cmDocumentation::SetSection
                ((cmDocumentation *)((long)&systemFile.field_2 + 8),"Name",cmDocumentationName);
      cmDocumentation::SetSection
                ((cmDocumentation *)((long)&systemFile.field_2 + 8),"Usage",cmDocumentationUsage);
      cmDocumentation::PrependSection
                ((cmDocumentation *)((long)&systemFile.field_2 + 8),"Options",cmDocumentationOptions
                );
      std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::vector
                ((vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *)&__range2_1)
      ;
      pDVar7 = cmCPackGeneratorFactory::GetGeneratorsList_abi_cxx11_
                         ((cmCPackGeneratorFactory *)&cpackGenerator);
      __end2_1 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::begin(pDVar7);
      g_1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::end(pDVar7);
      while (bVar8 = std::operator!=(&__end2_1,(_Self *)&g_1), bVar8) {
        e_1._64_8_ = std::
                     _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator*(&__end2_1);
        cmDocumentationEntry::cmDocumentationEntry((cmDocumentationEntry *)local_3e88);
        std::__cxx11::string::operator=((string *)local_3e88,(string *)e_1._64_8_);
        std::__cxx11::string::operator=
                  ((string *)(e_1.Name.field_2._M_local_buf + 8),(string *)(e_1._64_8_ + 0x20));
        std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::push_back
                  ((vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *)
                   &__range2_1,(value_type *)local_3e88);
        cmDocumentationEntry::~cmDocumentationEntry((cmDocumentationEntry *)local_3e88);
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator++(&__end2_1);
      }
      cmDocumentation::SetSection
                ((cmDocumentation *)((long)&systemFile.field_2 + 8),"Generators",
                 (vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *)&__range2_1)
      ;
      bVar8 = cmDocumentation::PrintRequestedDocumentation
                        ((cmDocumentation *)((long)&systemFile.field_2 + 8),(ostream *)&std::cout);
      argv_local._4_4_ = (uint)!bVar8;
      generator.field_2._12_4_ = 1;
      std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::~vector
                ((vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *)&__range2_1)
      ;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1dc8,"CMakeDetermineSystem.cmake",&local_1dc9);
    cmMakefile::GetModulesFile((string *)local_1da8,(cmMakefile *)local_1c18,&local_1dc8);
    std::__cxx11::string::~string((string *)&local_1dc8);
    std::allocator<char>::~allocator(&local_1dc9);
    bVar2 = cmMakefile::ReadListFile((cmMakefile *)local_1c18,(string *)local_1da8);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1fa8,"CMakeSystemSpecificInformation.cmake",&local_1fa9);
      cmMakefile::GetModulesFile(&local_1f88,(cmMakefile *)local_1c18,&local_1fa8);
      std::__cxx11::string::operator=((string *)local_1da8,(string *)&local_1f88);
      std::__cxx11::string::~string((string *)&local_1f88);
      std::__cxx11::string::~string((string *)&local_1fa8);
      std::allocator<char>::~allocator(&local_1fa9);
      bVar2 = cmMakefile::ReadListFile((cmMakefile *)local_1c18,(string *)local_1da8);
      if (bVar2) {
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2168,"CPACK_BUILD_CONFIG",&local_2169);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          cmMakefile::AddDefinition((cmMakefile *)local_1c18,&local_2168,pcVar5);
          std::__cxx11::string::~string((string *)&local_2168);
          std::allocator<char>::~allocator(&local_2169);
        }
        bVar2 = cmsys::SystemTools::FileExists((string *)&definitions.Log);
        if (bVar2) {
          cmsys::SystemTools::CollapseFullPath(&local_2190,(string *)&definitions.Log);
          std::__cxx11::string::operator=((string *)&definitions.Log,(string *)&local_2190);
          std::__cxx11::string::~string((string *)&local_2190);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2308);
          poVar4 = std::operator<<((ostream *)local_2308,"Read CPack configuration file: ");
          poVar4 = std::operator<<(poVar4,(string *)&definitions.Log);
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          std::__cxx11::ostringstream::str();
          pcVar5 = (char *)std::__cxx11::string::c_str();
          cmCPackLog::Log((cmCPackLog *)local_148,2,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                          ,0x116,pcVar5);
          std::__cxx11::string::~string(local_2328);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2308);
          bVar8 = cmMakefile::ReadListFile((cmMakefile *)local_1c18,(string *)&definitions.Log);
          if (bVar8) goto LAB_00140fd9;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_24a0);
          poVar4 = std::operator<<((ostream *)local_24a0,"Problem reading CPack config file: \"");
          poVar4 = std::operator<<(poVar4,(string *)&definitions.Log);
          poVar4 = std::operator<<(poVar4,"\"");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          std::__cxx11::ostringstream::str();
          pcVar5 = (char *)std::__cxx11::string::c_str();
          cmCPackLog::Log((cmCPackLog *)local_148,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                          ,0x11a,pcVar5);
          std::__cxx11::string::~string(local_24c0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_24a0);
          argv_local._4_4_ = 1;
          generator.field_2._12_4_ = 1;
        }
        else if (bVar8) {
LAB_00140fd9:
          uVar6 = std::__cxx11::string::empty();
          if ((uVar6 & 1) == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2678,"CPACK_GENERATOR",&local_2679);
            pcVar5 = (char *)std::__cxx11::string::c_str();
            cmMakefile::AddDefinition((cmMakefile *)local_1c18,&local_2678,pcVar5);
            std::__cxx11::string::~string((string *)&local_2678);
            std::allocator<char>::~allocator(&local_2679);
          }
          uVar6 = std::__cxx11::string::empty();
          if ((uVar6 & 1) == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_26a0,"CPACK_PACKAGE_NAME",&local_26a1);
            pcVar5 = (char *)std::__cxx11::string::c_str();
            cmMakefile::AddDefinition((cmMakefile *)local_1c18,&local_26a0,pcVar5);
            std::__cxx11::string::~string((string *)&local_26a0);
            std::allocator<char>::~allocator(&local_26a1);
          }
          uVar6 = std::__cxx11::string::empty();
          if ((uVar6 & 1) == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_26c8,"CPACK_PACKAGE_VERSION",&local_26c9);
            pcVar5 = (char *)std::__cxx11::string::c_str();
            cmMakefile::AddDefinition((cmMakefile *)local_1c18,&local_26c8,pcVar5);
            std::__cxx11::string::~string((string *)&local_26c8);
            std::allocator<char>::~allocator(&local_26c9);
          }
          uVar6 = std::__cxx11::string::empty();
          if ((uVar6 & 1) == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_26f0,"CPACK_PACKAGE_VENDOR",&local_26f1);
            pcVar5 = (char *)std::__cxx11::string::c_str();
            cmMakefile::AddDefinition((cmMakefile *)local_1c18,&local_26f0,pcVar5);
            std::__cxx11::string::~string((string *)&local_26f0);
            std::allocator<char>::~allocator(&local_26f1);
          }
          uVar6 = std::__cxx11::string::empty();
          if ((uVar6 & 1) == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2718,"CPACK_PACKAGE_DIRECTORY",&local_2719);
            pcVar5 = (char *)std::__cxx11::string::c_str();
            cmMakefile::AddDefinition((cmMakefile *)local_1c18,&local_2718,pcVar5);
            std::__cxx11::string::~string((string *)&local_2718);
            std::allocator<char>::~allocator(&local_2719);
          }
          else {
            cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
                      (&local_2740,(SystemTools *)0x1,collapse_01);
            std::__cxx11::string::operator=
                      ((string *)(cpackBuildConfig.field_2._M_local_buf + 8),(string *)&local_2740);
            std::__cxx11::string::~string((string *)&local_2740);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2760,"CPACK_PACKAGE_DIRECTORY",&local_2761);
            bVar8 = cmMakefile::IsSet((cmMakefile *)local_1c18,&local_2760);
            std::__cxx11::string::~string((string *)&local_2760);
            std::allocator<char>::~allocator(&local_2761);
            if (((bVar8 ^ 0xffU) & 1) != 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_2788,"CPACK_PACKAGE_DIRECTORY",
                         (allocator<char> *)((long)&__range2 + 7));
              pcVar5 = (char *)std::__cxx11::string::c_str();
              cmMakefile::AddDefinition((cmMakefile *)local_1c18,&local_2788,pcVar5);
              std::__cxx11::string::~string((string *)&local_2788);
              std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
            }
          }
          __end2 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&arg.LineLength);
          cd = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&arg.LineLength);
          while (bVar8 = std::operator!=(&__end2,(_Self *)&cd), bVar8) {
            name = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator*(&__end2);
            cpackModulesPath = (char *)name;
            pcVar5 = (char *)std::__cxx11::string::c_str();
            cmMakefile::AddDefinition((cmMakefile *)local_1c18,&name->first,pcVar5);
            std::
            _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator++(&__end2);
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_27d8,"CPACK_MODULE_PATH",&local_27d9);
          pcVar5 = cmMakefile::GetDefinition((cmMakefile *)local_1c18,&local_27d8);
          std::__cxx11::string::~string((string *)&local_27d8);
          std::allocator<char>::~allocator(&local_27d9);
          local_27b8 = pcVar5;
          if (pcVar5 != (char *)0x0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2800,"CMAKE_MODULE_PATH",
                       (allocator<char> *)((long)&genList + 7));
            cmMakefile::AddDefinition((cmMakefile *)local_1c18,&local_2800,local_27b8);
            std::__cxx11::string::~string((string *)&local_2800);
            std::allocator<char>::~allocator((allocator<char> *)((long)&genList + 7));
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2830,"CPACK_GENERATOR",&local_2831);
          pcVar5 = cmMakefile::GetDefinition((cmMakefile *)local_1c18,&local_2830);
          std::__cxx11::string::~string((string *)&local_2830);
          std::allocator<char>::~allocator(&local_2831);
          local_2810 = pcVar5;
          if (pcVar5 == (char *)0x0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_29b0);
            poVar4 = std::operator<<((ostream *)local_29b0,"CPack generator not specified");
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            std::__cxx11::ostringstream::str();
            pcVar5 = (char *)std::__cxx11::string::c_str();
            cmCPackLog::Log((cmCPackLog *)local_148,0x10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                            ,0x14d,pcVar5);
            std::__cxx11::string::~string
                      ((string *)
                       &generatorsVector.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_29b0);
          }
          else {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_29e8);
            pcVar5 = local_2810;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2a08,pcVar5,(allocator<char> *)((long)&__range3 + 7));
            cmSystemTools::ExpandListArgument
                      (&local_2a08,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_29e8,false);
            std::__cxx11::string::~string((string *)&local_2a08);
            std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
            __end3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_29e8);
            gen = (string *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_29e8);
            while (bVar8 = __gnu_cxx::operator!=
                                     (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               *)&gen), bVar8) {
              raii.Makefile =
                   (cmMakefile *)
                   __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end3);
              cmMakefile::ScopePushPop::ScopePushPop((ScopePushPop *)&mf,(cmMakefile *)local_1c18);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2bb8);
              poVar4 = std::operator<<((ostream *)local_2bb8,"Specified generator: ");
              poVar4 = std::operator<<(poVar4,(string *)raii.Makefile);
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              std::__cxx11::ostringstream::str();
              pcVar5 = (char *)std::__cxx11::string::c_str();
              cmCPackLog::Log((cmCPackLog *)local_148,2,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                              ,0x155,pcVar5);
              std::__cxx11::string::~string(local_2bd8);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2bb8);
              bVar8 = false;
              if (local_57c != 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2bf8,"CPACK_PACKAGE_NAME",&local_2bf9);
                pcVar5 = cmMakefile::GetDefinition((cmMakefile *)local_1c18,&local_2bf8);
                bVar8 = pcVar5 == (char *)0x0;
                std::__cxx11::string::~string((string *)&local_2bf8);
                std::allocator<char>::~allocator(&local_2bf9);
              }
              if (bVar8) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d78);
                poVar4 = std::operator<<((ostream *)local_2d78,"CPack project name not specified");
                std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
                std::__cxx11::ostringstream::str();
                pcVar5 = (char *)std::__cxx11::string::c_str();
                cmCPackLog::Log((cmCPackLog *)local_148,0x10,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                                ,0x158,pcVar5);
                std::__cxx11::string::~string(local_2d98);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d78);
                local_57c = 0;
              }
              local_2dba = 0;
              local_2dbb = 0;
              local_2de2 = 0;
              local_2de3 = 0;
              local_2e0a = 0;
              local_2e0b = 0;
              bVar2 = false;
              bVar8 = false;
              bVar9 = false;
              if (local_57c != 0) {
                std::allocator<char>::allocator();
                local_2dba = 1;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2db8,"CPACK_PACKAGE_VERSION",&local_2db9);
                local_2dbb = 1;
                pcVar5 = cmMakefile::GetDefinition((cmMakefile *)local_1c18,&local_2db8);
                bVar9 = true;
                if (pcVar5 == (char *)0x0) {
                  std::allocator<char>::allocator();
                  local_2de2 = 1;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_2de0,"CPACK_PACKAGE_VERSION_MAJOR",&local_2de1);
                  local_2de3 = 1;
                  pcVar5 = cmMakefile::GetDefinition((cmMakefile *)local_1c18,&local_2de0);
                  bVar9 = false;
                  if (pcVar5 != (char *)0x0) {
                    std::allocator<char>::allocator();
                    local_2e0a = 1;
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_2e08,"CPACK_PACKAGE_VERSION_MINOR",&local_2e09);
                    local_2e0b = 1;
                    pcVar5 = cmMakefile::GetDefinition((cmMakefile *)local_1c18,&local_2e08);
                    bVar9 = false;
                    if (pcVar5 != (char *)0x0) {
                      std::allocator<char>::allocator();
                      bVar2 = true;
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_2e30,"CPACK_PACKAGE_VERSION_PATCH",&local_2e31);
                      bVar8 = true;
                      pcVar5 = cmMakefile::GetDefinition((cmMakefile *)local_1c18,&local_2e30);
                      bVar9 = pcVar5 != (char *)0x0;
                    }
                  }
                }
                bVar9 = (bool)(bVar9 ^ 1);
              }
              if (bVar8) {
                std::__cxx11::string::~string((string *)&local_2e30);
              }
              if (bVar2) {
                std::allocator<char>::~allocator(&local_2e31);
              }
              if ((local_2e0b & 1) != 0) {
                std::__cxx11::string::~string((string *)&local_2e08);
              }
              if ((local_2e0a & 1) != 0) {
                std::allocator<char>::~allocator(&local_2e09);
              }
              if ((local_2de3 & 1) != 0) {
                std::__cxx11::string::~string((string *)&local_2de0);
              }
              if ((local_2de2 & 1) != 0) {
                std::allocator<char>::~allocator(&local_2de1);
              }
              if ((local_2dbb & 1) != 0) {
                std::__cxx11::string::~string((string *)&local_2db8);
              }
              if ((local_2dba & 1) != 0) {
                std::allocator<char>::~allocator(&local_2db9);
              }
              if (bVar9) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2fb0);
                poVar4 = std::operator<<((ostream *)local_2fb0,"CPack project version not specified"
                                        );
                poVar4 = (ostream *)
                         std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
                poVar4 = std::operator<<(poVar4,
                                         "Specify CPACK_PACKAGE_VERSION, or CPACK_PACKAGE_VERSION_MAJOR, CPACK_PACKAGE_VERSION_MINOR, and CPACK_PACKAGE_VERSION_PATCH."
                                        );
                std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
                std::__cxx11::ostringstream::str();
                pcVar5 = (char *)std::__cxx11::string::c_str();
                cmCPackLog::Log((cmCPackLog *)local_148,0x10,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                                ,0x167,pcVar5);
                std::__cxx11::string::~string(local_2fd0);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2fb0);
                local_57c = 0;
              }
              if (local_57c == 0) {
LAB_0014343f:
                generator.field_2._12_4_ = 0;
              }
              else {
                this = cmCPackGeneratorFactory::NewGenerator
                                 ((cmCPackGeneratorFactory *)&cpackGenerator,(string *)raii.Makefile
                                 );
                if (this == (cmCPackGenerator *)0x0) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3148);
                  poVar4 = std::operator<<((ostream *)local_3148,
                                           "Could not create CPack generator: ");
                  poVar4 = std::operator<<(poVar4,(string *)raii.Makefile);
                  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
                  std::__cxx11::ostringstream::str();
                  pcVar5 = (char *)std::__cxx11::string::c_str();
                  cmCPackLog::Log((cmCPackLog *)local_148,0x10,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                                  ,0x172,pcVar5);
                  std::__cxx11::string::~string((string *)&generatorDocs.Formatter.TextIndent);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3148);
                  cmDocumentation::cmDocumentation
                            ((cmDocumentation *)
                             &v.
                              super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::vector
                            ((vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *)
                             &__range6);
                  pDVar7 = cmCPackGeneratorFactory::GetGeneratorsList_abi_cxx11_
                                     ((cmCPackGeneratorFactory *)&cpackGenerator);
                  __end6 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::begin(pDVar7);
                  g = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::end(pDVar7);
                  while (bVar8 = std::operator!=(&__end6,(_Self *)&g), bVar8) {
                    e._64_8_ = std::
                               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::operator*(&__end6);
                    cmDocumentationEntry::cmDocumentationEntry((cmDocumentationEntry *)local_3290);
                    std::__cxx11::string::operator=((string *)local_3290,(string *)e._64_8_);
                    std::__cxx11::string::operator=
                              ((string *)(e.Name.field_2._M_local_buf + 8),
                               (string *)(e._64_8_ + 0x20));
                    std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::
                    push_back((vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *
                              )&__range6,(value_type *)local_3290);
                    cmDocumentationEntry::~cmDocumentationEntry((cmDocumentationEntry *)local_3290);
                    std::
                    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator++(&__end6);
                  }
                  cmDocumentation::SetSection
                            ((cmDocumentation *)
                             &v.
                              super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,"Generators",
                             (vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *)
                             &__range6);
                  std::operator<<((ostream *)&std::cerr,"\n");
                  cmDocumentation::PrintDocumentation
                            ((cmDocumentation *)
                             &v.
                              super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,ListGenerators,
                             (ostream *)&std::cerr);
                  local_57c = 0;
                  std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::~vector
                            ((vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *)
                             &__range6);
                  cmDocumentation::~cmDocumentation
                            ((cmDocumentation *)
                             &v.
                              super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                }
                else {
                  cmCPackGenerator::SetTrace(this,(bool)(helpFull.field_2._M_local_buf[0xc] & 1));
                  cmCPackGenerator::SetTraceExpand
                            (this,(bool)(helpFull.field_2._M_local_buf[0xb] & 1));
                }
                if ((local_57c != 0) &&
                   (iVar3 = cmCPackGenerator::Initialize
                                      (this,(string *)raii.Makefile,(cmMakefile *)local_1c18),
                   iVar3 == 0)) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3408);
                  poVar4 = std::operator<<((ostream *)local_3408,"Cannot initialize the generator ")
                  ;
                  poVar4 = std::operator<<(poVar4,(string *)raii.Makefile);
                  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
                  std::__cxx11::ostringstream::str();
                  pcVar5 = (char *)std::__cxx11::string::c_str();
                  cmCPackLog::Log((cmCPackLog *)local_148,0x10,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                                  ,0x186,pcVar5);
                  std::__cxx11::string::~string(local_3428);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3408);
                  local_57c = 0;
                }
                std::allocator<char>::allocator();
                local_3472 = 0;
                local_3473 = 0;
                local_349a = 0;
                local_349b = 0;
                bVar2 = false;
                bVar8 = false;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3448,"CPACK_INSTALL_COMMANDS",&local_3449);
                pcVar5 = cmMakefile::GetDefinition((cmMakefile *)local_1c18,&local_3448);
                bVar9 = false;
                if (pcVar5 == (char *)0x0) {
                  std::allocator<char>::allocator();
                  local_3472 = 1;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_3470,"CPACK_INSTALL_SCRIPT",&local_3471);
                  local_3473 = 1;
                  pcVar5 = cmMakefile::GetDefinition((cmMakefile *)local_1c18,&local_3470);
                  bVar9 = false;
                  if (pcVar5 == (char *)0x0) {
                    std::allocator<char>::allocator();
                    local_349a = 1;
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_3498,"CPACK_INSTALLED_DIRECTORIES",&local_3499);
                    local_349b = 1;
                    pcVar5 = cmMakefile::GetDefinition((cmMakefile *)local_1c18,&local_3498);
                    bVar9 = false;
                    if (pcVar5 == (char *)0x0) {
                      std::allocator<char>::allocator();
                      bVar2 = true;
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_34c0,"CPACK_INSTALL_CMAKE_PROJECTS",&local_34c1);
                      bVar8 = true;
                      pcVar5 = cmMakefile::GetDefinition((cmMakefile *)local_1c18,&local_34c0);
                      bVar9 = pcVar5 == (char *)0x0;
                    }
                  }
                }
                if (bVar8) {
                  std::__cxx11::string::~string((string *)&local_34c0);
                }
                if (bVar2) {
                  std::allocator<char>::~allocator(&local_34c1);
                }
                if ((local_349b & 1) != 0) {
                  std::__cxx11::string::~string((string *)&local_3498);
                }
                if ((local_349a & 1) != 0) {
                  std::allocator<char>::~allocator(&local_3499);
                }
                if ((local_3473 & 1) != 0) {
                  std::__cxx11::string::~string((string *)&local_3470);
                }
                if ((local_3472 & 1) != 0) {
                  std::allocator<char>::~allocator(&local_3471);
                }
                std::__cxx11::string::~string((string *)&local_3448);
                std::allocator<char>::~allocator(&local_3449);
                if (bVar9) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3640);
                  poVar4 = std::operator<<((ostream *)local_3640,
                                           "Please specify build tree of the project that uses CMake using CPACK_INSTALL_CMAKE_PROJECTS, specify CPACK_INSTALL_COMMANDS, CPACK_INSTALL_SCRIPT, or CPACK_INSTALLED_DIRECTORIES."
                                          );
                  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
                  std::__cxx11::ostringstream::str();
                  pcVar5 = (char *)std::__cxx11::string::c_str();
                  cmCPackLog::Log((cmCPackLog *)local_148,0x10,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                                  ,0x194,pcVar5);
                  std::__cxx11::string::~string((string *)&projName);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3640);
                  local_57c = 0;
                }
                if (local_57c == 0) goto LAB_0014343f;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3688,"CPACK_PACKAGE_NAME",&local_3689);
                pcVar5 = cmMakefile::GetDefinition((cmMakefile *)local_1c18,&local_3688);
                std::__cxx11::string::~string((string *)&local_3688);
                std::allocator<char>::~allocator(&local_3689);
                local_3668 = pcVar5;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3808);
                poVar4 = std::operator<<((ostream *)local_3808,"Use generator: ");
                iVar3 = (**this->_vptr_cmCPackGenerator)();
                poVar4 = std::operator<<(poVar4,(char *)CONCAT44(extraout_var,iVar3));
                std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
                std::__cxx11::ostringstream::str();
                pcVar5 = (char *)std::__cxx11::string::c_str();
                cmCPackLog::Log((cmCPackLog *)local_148,2,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                                ,0x19b,pcVar5);
                std::__cxx11::string::~string(local_3828);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3808);
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_39a0);
                poVar4 = std::operator<<((ostream *)local_39a0,"For project: ");
                poVar4 = std::operator<<(poVar4,local_3668);
                std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
                std::__cxx11::ostringstream::str();
                pcVar5 = (char *)std::__cxx11::string::c_str();
                cmCPackLog::Log((cmCPackLog *)local_148,2,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                                ,0x19d,pcVar5);
                std::__cxx11::string::~string((string *)&projVersion);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_39a0);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_39e8,"CPACK_PACKAGE_VERSION",
                           (allocator<char> *)((long)&projVersionMajor + 7));
                pcVar5 = cmMakefile::GetDefinition((cmMakefile *)local_1c18,&local_39e8);
                std::__cxx11::string::~string((string *)&local_39e8);
                std::allocator<char>::~allocator((allocator<char> *)((long)&projVersionMajor + 7));
                local_39c8 = pcVar5;
                if (pcVar5 == (char *)0x0) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_3a18,"CPACK_PACKAGE_VERSION_MAJOR",
                             (allocator<char> *)((long)&projVersionMinor + 7));
                  pcVar5 = cmMakefile::GetDefinition((cmMakefile *)local_1c18,&local_3a18);
                  std::__cxx11::string::~string((string *)&local_3a18);
                  std::allocator<char>::~allocator((allocator<char> *)((long)&projVersionMinor + 7))
                  ;
                  local_39f8 = pcVar5;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_3a48,"CPACK_PACKAGE_VERSION_MINOR",
                             (allocator<char> *)((long)&projVersionPatch + 7));
                  pcVar5 = cmMakefile::GetDefinition((cmMakefile *)local_1c18,&local_3a48);
                  std::__cxx11::string::~string((string *)&local_3a48);
                  std::allocator<char>::~allocator((allocator<char> *)((long)&projVersionPatch + 7))
                  ;
                  local_3a28 = pcVar5;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_3a78,"CPACK_PACKAGE_VERSION_PATCH",&local_3a79);
                  pcVar5 = cmMakefile::GetDefinition((cmMakefile *)local_1c18,&local_3a78);
                  std::__cxx11::string::~string((string *)&local_3a78);
                  std::allocator<char>::~allocator(&local_3a79);
                  local_3a58 = pcVar5;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3bf8);
                  poVar4 = std::operator<<((ostream *)local_3bf8,local_39f8);
                  poVar4 = std::operator<<(poVar4,".");
                  poVar4 = std::operator<<(poVar4,local_3a28);
                  poVar4 = std::operator<<(poVar4,".");
                  std::operator<<(poVar4,local_3a58);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_3c18,"CPACK_PACKAGE_VERSION",&local_3c19);
                  std::__cxx11::ostringstream::str();
                  pcVar5 = (char *)std::__cxx11::string::c_str();
                  cmMakefile::AddDefinition((cmMakefile *)local_1c18,&local_3c18,pcVar5);
                  std::__cxx11::string::~string(local_3c40);
                  std::__cxx11::string::~string((string *)&local_3c18);
                  std::allocator<char>::~allocator(&local_3c19);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3bf8);
                }
                iVar3 = (*this->_vptr_cmCPackGenerator[1])();
                if (iVar3 != 0) goto LAB_0014343f;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3dc0);
                poVar4 = std::operator<<((ostream *)local_3dc0,"Error when generating package: ");
                poVar4 = std::operator<<(poVar4,local_3668);
                std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
                std::__cxx11::ostringstream::str();
                pcVar5 = (char *)std::__cxx11::string::c_str();
                cmCPackLog::Log((cmCPackLog *)local_148,0x10,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                                ,0x1b2,pcVar5);
                std::__cxx11::string::~string(local_3de0);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3dc0);
                argv_local._4_4_ = 1;
                generator.field_2._12_4_ = 1;
              }
              cmMakefile::ScopePushPop::~ScopePushPop((ScopePushPop *)&mf);
              if (generator.field_2._12_4_ != 0) goto LAB_0014348c;
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&__end3);
            }
            generator.field_2._12_4_ = 0;
LAB_0014348c:
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_29e8);
            if (generator.field_2._12_4_ != 0) goto LAB_001434be;
          }
          generator.field_2._12_4_ = 0;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2638);
          poVar4 = std::operator<<((ostream *)local_2638,"Cannot find CPack config file: \"");
          poVar4 = std::operator<<(poVar4,(string *)&definitions.Log);
          poVar4 = std::operator<<(poVar4,"\"");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          std::__cxx11::ostringstream::str();
          pcVar5 = (char *)std::__cxx11::string::c_str();
          cmCPackLog::Log((cmCPackLog *)local_148,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                          ,0x120,pcVar5);
          std::__cxx11::string::~string(local_2658);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2638);
          argv_local._4_4_ = 1;
          generator.field_2._12_4_ = 1;
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2128);
        poVar4 = std::operator<<((ostream *)local_2128,
                                 "Error reading CMakeSystemSpecificInformation.cmake");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::__cxx11::ostringstream::str();
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log((cmCPackLog *)local_148,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                        ,0x10a,pcVar5);
        std::__cxx11::string::~string(local_2148);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2128);
        argv_local._4_4_ = 1;
        generator.field_2._12_4_ = 1;
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f48);
      poVar4 = std::operator<<((ostream *)local_1f48,"Error reading CMakeDetermineSystem.cmake");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log((cmCPackLog *)local_148,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                      ,0x101,pcVar5);
      std::__cxx11::string::~string(local_1f68);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f48);
      argv_local._4_4_ = 1;
      generator.field_2._12_4_ = 1;
    }
LAB_001434be:
    std::__cxx11::string::~string((string *)local_1da8);
    if (generator.field_2._12_4_ == 0) goto LAB_001434ed;
  }
  cmDocumentation::~cmDocumentation((cmDocumentation *)((long)&systemFile.field_2 + 8));
  cmCPackGeneratorFactory::~cmCPackGeneratorFactory((cmCPackGeneratorFactory *)&cpackGenerator);
  cmMakefile::~cmMakefile((cmMakefile *)local_1c18);
  cmGlobalGenerator::~cmGlobalGenerator((cmGlobalGenerator *)&globalMF.IsSourceFileTryCompile);
  cmake::~cmake((cmake *)local_da0);
  cmsys::CommandLineArguments::~CommandLineArguments((CommandLineArguments *)local_578);
  cpackDefinitions::~cpackDefinitions((cpackDefinitions *)&arg.LineLength);
  std::__cxx11::string::~string((string *)&definitions.Log);
  std::__cxx11::string::~string((string *)(cpackConfigFile.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(cpackProjectVendor.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(cpackProjectPatch.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(cpackProjectVersion.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(cpackBuildConfig.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(cpackProjectDirectory.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(cpackProjectName.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(helpHTML.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(helpMAN.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_3c8);
LAB_0014396a:
  cmCPackLog::~cmCPackLog((cmCPackLog *)local_148);
  cmsys::Encoding::CommandLineArguments::~CommandLineArguments((CommandLineArguments *)local_30);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char const* const* argv)
{
#if defined(_WIN32) && defined(CMAKE_BUILD_WITH_CMAKE)
  // Replace streambuf so we can output Unicode to console
  cmsys::ConsoleBuf::Manager consoleOut(std::cout);
  consoleOut.SetUTF8Pipes();
  cmsys::ConsoleBuf::Manager consoleErr(std::cerr, true);
  consoleErr.SetUTF8Pipes();
#endif
  cmsys::Encoding::CommandLineArguments args =
    cmsys::Encoding::CommandLineArguments::Main(argc, argv);
  argc = args.argc();
  argv = args.argv();

  cmSystemTools::EnableMSVCDebugHook();
  cmSystemTools::InitializeLibUV();
  cmSystemTools::FindCMakeResources(argv[0]);
  cmCPackLog log;

  log.SetErrorPrefix("CPack Error: ");
  log.SetWarningPrefix("CPack Warning: ");
  log.SetOutputPrefix("CPack: ");
  log.SetVerbosePrefix("CPack Verbose: ");

  if (cmSystemTools::GetCurrentWorkingDirectory().empty()) {
    cmCPack_Log(&log, cmCPackLog::LOG_ERROR,
                "Current working directory cannot be established."
                  << std::endl);
    return 1;
  }

  std::string generator;
  bool help = false;
  bool helpVersion = false;
  bool verbose = false;
  bool trace = false;
  bool traceExpand = false;
  bool debug = false;
  std::string helpFull;
  std::string helpMAN;
  std::string helpHTML;

  std::string cpackProjectName;
  std::string cpackProjectDirectory;
  std::string cpackBuildConfig;
  std::string cpackProjectVersion;
  std::string cpackProjectPatch;
  std::string cpackProjectVendor;
  std::string cpackConfigFile;

  cpackDefinitions definitions;
  definitions.Log = &log;

  cpackConfigFile.clear();

  cmsys::CommandLineArguments arg;
  arg.Initialize(argc, argv);
  typedef cmsys::CommandLineArguments argT;
  // Help arguments
  arg.AddArgument("--help", argT::NO_ARGUMENT, &help, "CPack help");
  arg.AddArgument("--help-full", argT::SPACE_ARGUMENT, &helpFull,
                  "CPack help");
  arg.AddArgument("--help-html", argT::SPACE_ARGUMENT, &helpHTML,
                  "CPack help");
  arg.AddArgument("--help-man", argT::SPACE_ARGUMENT, &helpMAN, "CPack help");
  arg.AddArgument("--version", argT::NO_ARGUMENT, &helpVersion, "CPack help");

  arg.AddArgument("-V", argT::NO_ARGUMENT, &verbose, "CPack verbose");
  arg.AddArgument("--verbose", argT::NO_ARGUMENT, &verbose, "-V");
  arg.AddArgument("--debug", argT::NO_ARGUMENT, &debug, "-V");
  arg.AddArgument("--config", argT::SPACE_ARGUMENT, &cpackConfigFile,
                  "CPack configuration file");
  arg.AddArgument("--trace", argT::NO_ARGUMENT, &trace,
                  "Put underlying cmake scripts in trace mode.");
  arg.AddArgument("--trace-expand", argT::NO_ARGUMENT, &traceExpand,
                  "Put underlying cmake scripts in expanded trace mode.");
  arg.AddArgument("-C", argT::SPACE_ARGUMENT, &cpackBuildConfig,
                  "CPack build configuration");
  arg.AddArgument("-G", argT::SPACE_ARGUMENT, &generator, "CPack generator");
  arg.AddArgument("-P", argT::SPACE_ARGUMENT, &cpackProjectName,
                  "CPack project name");
  arg.AddArgument("-R", argT::SPACE_ARGUMENT, &cpackProjectVersion,
                  "CPack project version");
  arg.AddArgument("-B", argT::SPACE_ARGUMENT, &cpackProjectDirectory,
                  "CPack project directory");
  arg.AddArgument("--patch", argT::SPACE_ARGUMENT, &cpackProjectPatch,
                  "CPack project patch");
  arg.AddArgument("--vendor", argT::SPACE_ARGUMENT, &cpackProjectVendor,
                  "CPack project vendor");
  arg.AddCallback("-D", argT::SPACE_ARGUMENT, cpackDefinitionArgument,
                  &definitions, "CPack Definitions");
  arg.SetUnknownArgumentCallback(cpackUnknownArgument);

  // Parse command line
  int parsed = arg.Parse();

  // Setup logging
  if (verbose) {
    log.SetVerbose(verbose);
    cmCPack_Log(&log, cmCPackLog::LOG_OUTPUT, "Enable Verbose" << std::endl);
  }
  if (debug) {
    log.SetDebug(debug);
    cmCPack_Log(&log, cmCPackLog::LOG_OUTPUT, "Enable Debug" << std::endl);
  }

  cmCPack_Log(&log, cmCPackLog::LOG_VERBOSE,
              "Read CPack config file: " << cpackConfigFile << std::endl);

  cmake cminst(cmake::RoleScript, cmState::CPack);
  cminst.SetHomeDirectory("");
  cminst.SetHomeOutputDirectory("");
  cminst.SetProgressCallback(cpackProgressCallback);
  cminst.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator cmgg(&cminst);
  cmMakefile globalMF(&cmgg, cminst.GetCurrentSnapshot());
#if defined(__CYGWIN__)
  globalMF.AddDefinition("CMAKE_LEGACY_CYGWIN_WIN32", "0");
#endif

  if (trace) {
    cminst.SetTrace(true);
  }
  if (traceExpand) {
    cminst.SetTrace(true);
    cminst.SetTraceExpand(true);
  }

  bool cpackConfigFileSpecified = true;
  if (cpackConfigFile.empty()) {
    cpackConfigFile = cmSystemTools::GetCurrentWorkingDirectory();
    cpackConfigFile += "/CPackConfig.cmake";
    cpackConfigFileSpecified = false;
  }

  cmCPackGeneratorFactory generators;
  generators.SetLogger(&log);
  cmCPackGenerator* cpackGenerator = nullptr;

  cmDocumentation doc;
  doc.addCPackStandardDocSections();
  /* Were we invoked to display doc or to do some work ?
   * Unlike cmake launching cpack with zero argument
   * should launch cpack using "cpackConfigFile" if it exists
   * in the current directory.
   */
  help = doc.CheckOptions(argc, argv, "-G") && argc != 1;

  // This part is used for cpack documentation lookup as well.
  cminst.AddCMakePaths();

  if (parsed && !help) {
    // find out which system cpack is running on, so it can setup the search
    // paths, so FIND_XXX() commands can be used in scripts
    std::string systemFile =
      globalMF.GetModulesFile("CMakeDetermineSystem.cmake");
    if (!globalMF.ReadListFile(systemFile)) {
      cmCPack_Log(&log, cmCPackLog::LOG_ERROR,
                  "Error reading CMakeDetermineSystem.cmake" << std::endl);
      return 1;
    }

    systemFile =
      globalMF.GetModulesFile("CMakeSystemSpecificInformation.cmake");
    if (!globalMF.ReadListFile(systemFile)) {
      cmCPack_Log(&log, cmCPackLog::LOG_ERROR,
                  "Error reading CMakeSystemSpecificInformation.cmake"
                    << std::endl);
      return 1;
    }

    if (!cpackBuildConfig.empty()) {
      globalMF.AddDefinition("CPACK_BUILD_CONFIG", cpackBuildConfig.c_str());
    }

    if (cmSystemTools::FileExists(cpackConfigFile)) {
      cpackConfigFile = cmSystemTools::CollapseFullPath(cpackConfigFile);
      cmCPack_Log(&log, cmCPackLog::LOG_VERBOSE,
                  "Read CPack configuration file: " << cpackConfigFile
                                                    << std::endl);
      if (!globalMF.ReadListFile(cpackConfigFile)) {
        cmCPack_Log(&log, cmCPackLog::LOG_ERROR,
                    "Problem reading CPack config file: \""
                      << cpackConfigFile << "\"" << std::endl);
        return 1;
      }
    } else if (cpackConfigFileSpecified) {
      cmCPack_Log(&log, cmCPackLog::LOG_ERROR,
                  "Cannot find CPack config file: \"" << cpackConfigFile
                                                      << "\"" << std::endl);
      return 1;
    }

    if (!generator.empty()) {
      globalMF.AddDefinition("CPACK_GENERATOR", generator.c_str());
    }
    if (!cpackProjectName.empty()) {
      globalMF.AddDefinition("CPACK_PACKAGE_NAME", cpackProjectName.c_str());
    }
    if (!cpackProjectVersion.empty()) {
      globalMF.AddDefinition("CPACK_PACKAGE_VERSION",
                             cpackProjectVersion.c_str());
    }
    if (!cpackProjectVendor.empty()) {
      globalMF.AddDefinition("CPACK_PACKAGE_VENDOR",
                             cpackProjectVendor.c_str());
    }
    // if this is not empty it has been set on the command line
    // go for it. Command line override values set in config file.
    if (!cpackProjectDirectory.empty()) {
      globalMF.AddDefinition("CPACK_PACKAGE_DIRECTORY",
                             cpackProjectDirectory.c_str());
    }
    // The value has not been set on the command line
    else {
      // get a default value (current working directory)
      cpackProjectDirectory = cmsys::SystemTools::GetCurrentWorkingDirectory();
      // use default value iff no value has been provided by the config file
      if (!globalMF.IsSet("CPACK_PACKAGE_DIRECTORY")) {
        globalMF.AddDefinition("CPACK_PACKAGE_DIRECTORY",
                               cpackProjectDirectory.c_str());
      }
    }
    for (auto const& cd : definitions.Map) {
      globalMF.AddDefinition(cd.first, cd.second.c_str());
    }

    const char* cpackModulesPath = globalMF.GetDefinition("CPACK_MODULE_PATH");
    if (cpackModulesPath) {
      globalMF.AddDefinition("CMAKE_MODULE_PATH", cpackModulesPath);
    }
    const char* genList = globalMF.GetDefinition("CPACK_GENERATOR");
    if (!genList) {
      cmCPack_Log(&log, cmCPackLog::LOG_ERROR,
                  "CPack generator not specified" << std::endl);
    } else {
      std::vector<std::string> generatorsVector;
      cmSystemTools::ExpandListArgument(genList, generatorsVector);
      for (std::string const& gen : generatorsVector) {
        cmMakefile::ScopePushPop raii(&globalMF);
        cmMakefile* mf = &globalMF;
        cmCPack_Log(&log, cmCPackLog::LOG_VERBOSE,
                    "Specified generator: " << gen << std::endl);
        if (parsed && !mf->GetDefinition("CPACK_PACKAGE_NAME")) {
          cmCPack_Log(&log, cmCPackLog::LOG_ERROR,
                      "CPack project name not specified" << std::endl);
          parsed = 0;
        }
        if (parsed &&
            !(mf->GetDefinition("CPACK_PACKAGE_VERSION") ||
              (mf->GetDefinition("CPACK_PACKAGE_VERSION_MAJOR") &&
               mf->GetDefinition("CPACK_PACKAGE_VERSION_MINOR") &&
               mf->GetDefinition("CPACK_PACKAGE_VERSION_PATCH")))) {
          cmCPack_Log(&log, cmCPackLog::LOG_ERROR,
                      "CPack project version not specified"
                        << std::endl
                        << "Specify CPACK_PACKAGE_VERSION, or "
                           "CPACK_PACKAGE_VERSION_MAJOR, "
                           "CPACK_PACKAGE_VERSION_MINOR, and "
                           "CPACK_PACKAGE_VERSION_PATCH."
                        << std::endl);
          parsed = 0;
        }
        if (parsed) {
          cpackGenerator = generators.NewGenerator(gen);
          if (cpackGenerator) {
            cpackGenerator->SetTrace(trace);
            cpackGenerator->SetTraceExpand(traceExpand);
          } else {
            cmCPack_Log(&log, cmCPackLog::LOG_ERROR,
                        "Could not create CPack generator: " << gen
                                                             << std::endl);
            // Print out all the valid generators
            cmDocumentation generatorDocs;
            std::vector<cmDocumentationEntry> v;
            for (auto const& g : generators.GetGeneratorsList()) {
              cmDocumentationEntry e;
              e.Name = g.first;
              e.Brief = g.second;
              v.push_back(std::move(e));
            }
            generatorDocs.SetSection("Generators", v);
            std::cerr << "\n";
            generatorDocs.PrintDocumentation(cmDocumentation::ListGenerators,
                                             std::cerr);
            parsed = 0;
          }

          if (parsed && !cpackGenerator->Initialize(gen, mf)) {
            cmCPack_Log(&log, cmCPackLog::LOG_ERROR,
                        "Cannot initialize the generator " << gen
                                                           << std::endl);
            parsed = 0;
          }

          if (!mf->GetDefinition("CPACK_INSTALL_COMMANDS") &&
              !mf->GetDefinition("CPACK_INSTALL_SCRIPT") &&
              !mf->GetDefinition("CPACK_INSTALLED_DIRECTORIES") &&
              !mf->GetDefinition("CPACK_INSTALL_CMAKE_PROJECTS")) {
            cmCPack_Log(
              &log, cmCPackLog::LOG_ERROR,
              "Please specify build tree of the project that uses CMake "
              "using CPACK_INSTALL_CMAKE_PROJECTS, specify "
              "CPACK_INSTALL_COMMANDS, CPACK_INSTALL_SCRIPT, or "
              "CPACK_INSTALLED_DIRECTORIES."
                << std::endl);
            parsed = 0;
          }
          if (parsed) {
            const char* projName = mf->GetDefinition("CPACK_PACKAGE_NAME");
            cmCPack_Log(&log, cmCPackLog::LOG_VERBOSE,
                        "Use generator: " << cpackGenerator->GetNameOfClass()
                                          << std::endl);
            cmCPack_Log(&log, cmCPackLog::LOG_VERBOSE,
                        "For project: " << projName << std::endl);

            const char* projVersion =
              mf->GetDefinition("CPACK_PACKAGE_VERSION");
            if (!projVersion) {
              const char* projVersionMajor =
                mf->GetDefinition("CPACK_PACKAGE_VERSION_MAJOR");
              const char* projVersionMinor =
                mf->GetDefinition("CPACK_PACKAGE_VERSION_MINOR");
              const char* projVersionPatch =
                mf->GetDefinition("CPACK_PACKAGE_VERSION_PATCH");
              std::ostringstream ostr;
              ostr << projVersionMajor << "." << projVersionMinor << "."
                   << projVersionPatch;
              mf->AddDefinition("CPACK_PACKAGE_VERSION", ostr.str().c_str());
            }

            int res = cpackGenerator->DoPackage();
            if (!res) {
              cmCPack_Log(&log, cmCPackLog::LOG_ERROR,
                          "Error when generating package: " << projName
                                                            << std::endl);
              return 1;
            }
          }
        }
      }
    }
  }

  /* In this case we are building the documentation object
   * instance in order to create appropriate structure
   * in order to satisfy the appropriate --help-xxx request
   */
  if (help) {
    // Construct and print requested documentation.

    doc.SetName("cpack");
    doc.SetSection("Name", cmDocumentationName);
    doc.SetSection("Usage", cmDocumentationUsage);
    doc.PrependSection("Options", cmDocumentationOptions);

    std::vector<cmDocumentationEntry> v;
    for (auto const& g : generators.GetGeneratorsList()) {
      cmDocumentationEntry e;
      e.Name = g.first;
      e.Brief = g.second;
      v.push_back(std::move(e));
    }
    doc.SetSection("Generators", v);

    return doc.PrintRequestedDocumentation(std::cout) ? 0 : 1;
  }

  if (cmSystemTools::GetErrorOccuredFlag()) {
    return 1;
  }

  return 0;
}